

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O3

ans_fold_decode<5U> *
ans_fold_decode<5U>::load(ans_fold_decode<5U> *__return_storage_ptr__,uint8_t *in_u8)

{
  uint uVar1;
  pointer puVar2;
  pointer pdVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  uint64_t uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  ushort uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 extraout_var [56];
  undefined1 auVar24 [64];
  undefined1 in_XMM7 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ans_load_interp(&local_30,in_u8);
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar10 = 0;
  }
  else {
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    uVar12 = 0;
    auVar21 = vpbroadcastq_avx512f();
    auVar21 = vpsrlq_avx512f(auVar21,2);
    do {
      auVar22 = vpbroadcastq_avx512f();
      auVar23 = vmovdqa64_avx512f(auVar24);
      auVar24 = vporq_avx512f(auVar22,auVar19);
      auVar22 = vporq_avx512f(auVar22,auVar20);
      uVar7 = vpcmpuq_avx512f(auVar22,auVar21,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar24,auVar21,2);
      bVar9 = (byte)uVar7;
      uVar17 = CONCAT11(bVar9,bVar8);
      auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                   (local_30.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + uVar12));
      auVar22._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar24._4_4_;
      auVar22._0_4_ = (uint)(bVar8 & 1) * auVar24._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar24._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar24._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar17 >> 4) & 1) * auVar24._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar17 >> 5) & 1) * auVar24._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar17 >> 6) & 1) * auVar24._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar17 >> 7) & 1) * auVar24._28_4_;
      auVar22._32_4_ = (uint)(bVar9 & 1) * auVar24._32_4_;
      auVar22._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar24._36_4_;
      auVar22._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar24._40_4_;
      auVar22._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar24._44_4_;
      auVar22._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar24._48_4_;
      auVar22._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar24._52_4_;
      auVar22._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar24._56_4_;
      auVar22._60_4_ = (uint)(bVar9 >> 7) * auVar24._60_4_;
      uVar12 = uVar12 + 0x10;
      auVar24 = vpaddd_avx512f(auVar22,auVar23);
    } while ((((ulong)((long)local_30.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish +
                      (-4 - (long)local_30.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) >> 2) + 0x10 &
             0xfffffffffffffff0) != uVar12);
    auVar19 = vmovdqa32_avx512f(auVar24);
    auVar20._0_4_ = (uint)(bVar8 & 1) * auVar19._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar23._0_4_;
    bVar4 = (bool)((byte)(uVar17 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar4 * auVar19._4_4_ | (uint)!bVar4 * auVar23._4_4_;
    bVar4 = (bool)((byte)(uVar17 >> 2) & 1);
    auVar20._8_4_ = (uint)bVar4 * auVar19._8_4_ | (uint)!bVar4 * auVar23._8_4_;
    bVar4 = (bool)((byte)(uVar17 >> 3) & 1);
    auVar20._12_4_ = (uint)bVar4 * auVar19._12_4_ | (uint)!bVar4 * auVar23._12_4_;
    bVar4 = (bool)((byte)(uVar17 >> 4) & 1);
    auVar20._16_4_ = (uint)bVar4 * auVar19._16_4_ | (uint)!bVar4 * auVar23._16_4_;
    bVar4 = (bool)((byte)(uVar17 >> 5) & 1);
    auVar20._20_4_ = (uint)bVar4 * auVar19._20_4_ | (uint)!bVar4 * auVar23._20_4_;
    bVar4 = (bool)((byte)(uVar17 >> 6) & 1);
    auVar20._24_4_ = (uint)bVar4 * auVar19._24_4_ | (uint)!bVar4 * auVar23._24_4_;
    bVar4 = (bool)((byte)(uVar17 >> 7) & 1);
    auVar20._28_4_ = (uint)bVar4 * auVar19._28_4_ | (uint)!bVar4 * auVar23._28_4_;
    auVar20._32_4_ = (uint)(bVar9 & 1) * auVar19._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar23._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar20._36_4_ = (uint)bVar4 * auVar19._36_4_ | (uint)!bVar4 * auVar23._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar20._40_4_ = (uint)bVar4 * auVar19._40_4_ | (uint)!bVar4 * auVar23._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar20._44_4_ = (uint)bVar4 * auVar19._44_4_ | (uint)!bVar4 * auVar23._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar20._48_4_ = (uint)bVar4 * auVar19._48_4_ | (uint)!bVar4 * auVar23._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar20._52_4_ = (uint)bVar4 * auVar19._52_4_ | (uint)!bVar4 * auVar23._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar20._56_4_ = (uint)bVar4 * auVar19._56_4_ | (uint)!bVar4 * auVar23._56_4_;
    auVar20._60_4_ =
         (uint)(bVar9 >> 7) * auVar19._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar23._60_4_;
    auVar18 = vextracti64x4_avx512f(auVar20,1);
    auVar19 = vpaddd_avx512f(auVar20,ZEXT3264(auVar18));
    auVar5 = vpaddd_avx(auVar19._0_16_,auVar19._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    uVar10 = (uint64_t)auVar5._0_4_;
  }
  auVar5 = vcvtusi2sd_avx512f(in_XMM7,uVar10);
  __return_storage_ptr__->frame_size = uVar10;
  __return_storage_ptr__->frame_mask = uVar10 - 1;
  auVar19._0_8_ = log2(auVar5._0_8_);
  auVar19._8_56_ = extraout_var;
  uVar10 = vcvttsd2usi_avx512f(auVar19._0_16_);
  __return_storage_ptr__->frame_log2 = uVar10;
  std::vector<dec_entry_fold,_std::allocator<dec_entry_fold>_>::resize
            (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size);
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (__return_storage_ptr__->table).
           super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
  lVar13 = 0;
  iVar14 = 0;
  do {
    uVar1 = puVar2[lVar13];
    uVar16 = 0;
    if ((ulong)uVar1 != 0) {
      uVar16 = (uint)lVar13;
      uVar15 = uVar16 - 0x1000;
      uVar15 = (uVar15 / 0xff0) * 0x40000000 + 0x40000000 +
               ((uVar15 / 0xff0 + 1) * -0xff0 + uVar16 << ((ulong)((uVar15 / 0xff0) * 8 + 8) & 0x3f)
               );
      if (uVar16 < 0x1000) {
        uVar15 = uVar16;
      }
      uVar12 = 0;
      do {
        uVar16 = iVar14 + (int)uVar12;
        pdVar3[uVar16].freq = (uint16_t)uVar1;
        pdVar3[uVar16].mapped_num = uVar15;
        pdVar3[uVar16].offset = (uint16_t)uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar1 != uVar12);
      uVar16 = puVar2[lVar13];
    }
    iVar14 = iVar14 + uVar16;
    lVar13 = lVar13 + 1;
  } while (lVar13 != lVar11 + (ulong)(lVar11 == 0));
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_fold_decode load(const uint8_t* in_u8)
    {
        ans_fold_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        auto max_norm_freq
            = *std::max_element(model.nfreqs.begin(), model.nfreqs.end());
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint32_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                uint32_t except_bytes = ans_fold_exception_bytes<fidelity>(sym);
                model.table[cur_base + k].mapped_num
                    = ans_fold_undo_mapping<fidelity>(sym)
                    + (except_bytes << 30);
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }